

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O1

void Abc_SclInsertBarBufs(Abc_Ntk_t *pNtk,Vec_Int_t *vBufs)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  if (0 < vBufs->nSize) {
    lVar3 = 0;
    do {
      iVar1 = vBufs->pArray[lVar3];
      if (((long)iVar1 < 0) || (pNtk->vObjs->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pNtk->vObjs->pArray[iVar1];
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)pvVar2 + 0x38) = 0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < vBufs->nSize);
  }
  return;
}

Assistant:

void Abc_SclInsertBarBufs( Abc_Ntk_t * pNtk, Vec_Int_t * vBufs )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachObjVec( vBufs, pNtk, pObj, i )
        pObj->pData = NULL;
}